

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_to_string.cpp
# Opt level: O1

wstring * __thiscall
mjs::number_to_string_abi_cxx11_(wstring *__return_storage_ptr__,mjs *this,double m)

{
  uint *puVar1;
  byte bVar2;
  wstring *pwVar3;
  int extraout_EDX;
  int extraout_EDX_00;
  int k;
  wchar_t *pwVar4;
  wchar_t *pwVar5;
  ulong uVar6;
  bool bVar7;
  double t;
  ostringstream woss;
  double local_350;
  long *local_348 [2];
  long local_338 [2];
  wstring local_328;
  byte abStack_308 [88];
  ios_base local_2b0 [264];
  long local_1a8;
  ulong local_1a0 [2];
  uint auStack_190 [22];
  ios_base local_138 [264];
  
  if (NAN(m)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pwVar5 = L"NaN";
    pwVar4 = L"";
  }
  else if ((m != 0.0) || (NAN(m))) {
    if (m < 0.0) {
      number_to_string_abi_cxx11_(&local_328,this,-m);
      pwVar3 = (wstring *)
               std::__cxx11::wstring::replace((ulong)&local_328,0,(wchar_t *)0x0,0x1a5bc8);
      std::__cxx11::wstring::wstring((wstring *)__return_storage_ptr__,pwVar3);
      if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
           *)local_328._M_dataplus._M_p == &local_328.field_2) {
        return __return_storage_ptr__;
      }
      operator_delete(local_328._M_dataplus._M_p,local_328.field_2._M_allocated_capacity * 4 + 4);
      return __return_storage_ptr__;
    }
    if (m < INFINITY) {
      uVar6 = 1;
      bVar7 = false;
      while( true ) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        *(ulong *)((long)local_1a0 + *(long *)(local_1a8 + -0x18)) = uVar6;
        puVar1 = (uint *)((long)auStack_190 + *(long *)(local_1a8 + -0x18));
        *puVar1 = *puVar1 & 0xfffffefb;
        std::ostream::_M_insert<double>(m);
        std::__cxx11::stringbuf::str();
        std::__cxx11::istringstream::istringstream
                  ((istringstream *)&local_328,(string *)local_348,_S_in);
        std::istream::_M_extract<double>((double *)&local_328);
        bVar2 = abStack_308[*(long *)(local_328._M_dataplus._M_p + -6)];
        std::__cxx11::istringstream::~istringstream((istringstream *)&local_328);
        std::ios_base::~ios_base(local_2b0);
        k = extraout_EDX;
        if (local_348[0] != local_338) {
          operator_delete(local_348[0],local_338[0] + 1);
          k = extraout_EDX_00;
        }
        if ((bVar2 & 5) == 0 && local_350 == m) break;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
        std::ios_base::~ios_base(local_138);
        bVar7 = 0x10 < uVar6;
        uVar6 = uVar6 + 1;
        if (uVar6 == 0x12) {
LAB_0014d616:
          __assert_fail("false",
                        "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/number_to_string.cpp"
                        ,0x9a,"std::wstring mjs::number_to_string(double)");
        }
      }
      do_format_double_abi_cxx11_(__return_storage_ptr__,(mjs *)(uVar6 & 0xffffffff),m,k);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
      std::ios_base::~ios_base(local_138);
      if (!bVar7) {
        return __return_storage_ptr__;
      }
      goto LAB_0014d616;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pwVar5 = L"Infinity";
    pwVar4 = L"";
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pwVar5 = L"0";
    pwVar4 = L"";
  }
  std::__cxx11::wstring::_M_construct<wchar_t_const*>
            ((wstring *)__return_storage_ptr__,pwVar5,pwVar4);
  return __return_storage_ptr__;
}

Assistant:

std::wstring number_to_string(double m) {
    // Handle special cases
    if (std::isnan(m)) {
        return L"NaN";
    }
    if (m == 0) {
        return L"0";
    }
    if (m < 0) {
        return L"-" + number_to_string(-m);
    }
    if (std::isinf(m)) {
        return L"Infinity";
    }

    assert(std::isfinite(m) && m > 0);

    // 9.8.1 ToString Applied to the Number Type    

    // Use really slow method to determine shortest representation of m
    for (int k = 1; k <= 17; ++k) {
        std::ostringstream woss;
        woss.precision(k);
        woss << std::defaultfloat << m;
        if (double t; std::istringstream{woss.str()} >> t && t == m) {
            return do_format_double(m, k);
        }
    }
    // More than 17 digits should never happen
    assert(false);
    throw std::runtime_error("Internal error");
}